

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness-traversal.h
# Opt level: O3

void __thiscall
wasm::LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_>::
scanLivenessThroughActions
          (LivenessWalker<wasm::SpillPointers,_wasm::Visitor<wasm::SpillPointers,_void>_> *this,
          vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *actions,
          SetOfLocals *live)

{
  int iVar1;
  pointer pLVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar4 = (int)((long)(actions->
                      super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(actions->
                      super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (0 < (int)uVar4) {
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    uVar6 = uVar5 + 1;
    lVar3 = uVar5 * 0x18 + -0x14;
    do {
      pLVar2 = (actions->
               super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>).
               _M_impl.super__Vector_impl_data._M_start;
      iVar1 = *(int *)((long)pLVar2 + lVar3 + -4);
      if (iVar1 == 1) {
        SortedVector::erase(live,*(Index *)((long)&pLVar2->what + lVar3));
      }
      else if (iVar1 == 0) {
        SortedVector::insert(live,*(Index *)((long)&pLVar2->what + lVar3));
      }
      uVar6 = uVar6 - 1;
      lVar3 = lVar3 + -0x18;
    } while (1 < uVar6);
  }
  return;
}

Assistant:

void scanLivenessThroughActions(std::vector<LivenessAction>& actions,
                                  SetOfLocals& live) {
    // move towards the front
    for (int i = int(actions.size()) - 1; i >= 0; i--) {
      auto& action = actions[i];
      if (action.isGet()) {
        live.insert(action.index);
      } else if (action.isSet()) {
        live.erase(action.index);
      }
    }
  }